

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_parse_finished(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  int iVar2;
  uchar *A;
  ulong uVar3;
  long lVar4;
  uchar diff;
  uchar buf [12];
  byte local_1d;
  undefined8 local_1c;
  undefined4 local_14;
  
  (*ssl->handshake->calc_finished)(ssl,(uchar *)&local_1c,~*(uint *)&ssl->conf->field_0x174 & 1);
  iVar2 = mbedtls_ssl_read_record(ssl);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (ssl->in_msgtype == 0x16) {
    pmVar1 = ssl->conf;
    if (*ssl->in_msg == '\x14') {
      uVar3 = (ulong)((pmVar1->field_0x174 & 2) >> 1) * 8;
      if (ssl->in_hslen == uVar3 + 0x10) {
        local_1d = 0;
        lVar4 = 0;
        do {
          local_1d = local_1d |
                     ssl->in_msg[lVar4 + (uVar3 | 4)] ^ *(byte *)((long)&local_1c + lVar4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xc);
        if (local_1d == 0) {
          ssl->verify_data_len = 0xc;
          *(undefined4 *)(ssl->peer_verify_data + 8) = local_14;
          *(undefined8 *)ssl->peer_verify_data = local_1c;
          if (ssl->handshake->resume == 0) {
            ssl->state = ssl->state + 1;
          }
          else if (((pmVar1->field_0x174 & 1) != 0) ||
                  (ssl->state = 10, (pmVar1->field_0x174 & 1) != 0)) {
            ssl->state = 0xf;
          }
          if ((pmVar1->field_0x174 & 2) == 0) {
            return 0;
          }
          mbedtls_ssl_recv_flight_completed(ssl);
          return 0;
        }
        iVar2 = -0x7e80;
        if (pmVar1 == (mbedtls_ssl_config *)0x0) {
          return -0x7e80;
        }
        ssl->out_msgtype = 0x15;
        ssl->out_msglen = 2;
        *ssl->out_msg = '\x02';
        ssl->out_msg[1] = '2';
        goto LAB_00114eb7;
      }
    }
    else if (pmVar1 == (mbedtls_ssl_config *)0x0) {
      return -0x7e80;
    }
    ssl->out_msgtype = 0x15;
    ssl->out_msglen = 2;
    *ssl->out_msg = '\x02';
    ssl->out_msg[1] = '2';
    mbedtls_ssl_write_record(ssl);
    return -0x7e80;
  }
  iVar2 = -0x7700;
  if (ssl->conf == (mbedtls_ssl_config *)0x0) {
    return -0x7700;
  }
  ssl->out_msgtype = 0x15;
  ssl->out_msglen = 2;
  *ssl->out_msg = '\x02';
  ssl->out_msg[1] = '\n';
LAB_00114eb7:
  mbedtls_ssl_write_record(ssl);
  return iVar2;
}

Assistant:

int mbedtls_ssl_parse_finished( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned int hash_len;
    unsigned char buf[SSL_MAX_HASH_LEN];

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse finished" ) );

    ssl->handshake->calc_finished( ssl, buf, ssl->conf->endpoint ^ 1 );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /* There is currently no ciphersuite using another length with TLS 1.2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        hash_len = 36;
    else
#endif
        hash_len = 12;

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_FINISHED ||
        ssl->in_hslen  != mbedtls_ssl_hs_hdr_len( ssl ) + hash_len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

    if( mbedtls_ssl_safer_memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ),
                      buf, hash_len ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->verify_data_len = hash_len;
    memcpy( ssl->peer_verify_data, buf, hash_len );
#endif

    if( ssl->handshake->resume != 0 )
    {
#if defined(MBEDTLS_SSL_CLI_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
            ssl->state = MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC;
#endif
#if defined(MBEDTLS_SSL_SRV_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
#endif
    }
    else
        ssl->state++;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        mbedtls_ssl_recv_flight_completed( ssl );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse finished" ) );

    return( 0 );
}